

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O2

ssh_keyalg * opensshcert_related_alg(ssh_keyalg *self,ssh_keyalg *base)

{
  long *plVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 == 0x40) {
      return self;
    }
    plVar1 = (long *)((long)opensshcert_all_keyalgs + lVar2);
    lVar2 = lVar2 + 8;
  } while (((ssh_keyalg *)*plVar1)->base_alg != base);
  return (ssh_keyalg *)*plVar1;
}

Assistant:

static const ssh_keyalg *opensshcert_related_alg(const ssh_keyalg *self,
                                                 const ssh_keyalg *base)
{
    for (size_t i = 0; i < lenof(opensshcert_all_keyalgs); i++) {
        const ssh_keyalg *alg_i = opensshcert_all_keyalgs[i];
        if (base == alg_i->base_alg)
            return alg_i;
    }

    return self;
}